

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall
kratos::FSM::generate_output
          (FSM *this,Enum *enum_def,EnumVar *current_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  Var *var;
  Generator *this_00;
  pointer this_01;
  bool bVar1;
  size_type num;
  reference ppFVar2;
  mapped_type *pmVar3;
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *this_02;
  size_type sVar4;
  reference ppVVar5;
  reference __k;
  mapped_type *ppVVar6;
  unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *puVar7;
  element_type *peVar8;
  mapped_type *__args;
  element_type *this_03;
  ScopedStmtBlock *pSVar9;
  StmtBlock *this_04;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar10;
  format_args args;
  string_view format_str;
  shared_ptr<kratos::Stmt> local_2e0;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [48];
  ScopedStmtBlock *local_280;
  ScopedStmtBlock *case_stmt;
  _Node_iterator_base<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>
  local_270;
  undefined1 local_268 [8];
  unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  debug_info;
  undefined1 local_220 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  Var *value;
  Var **output_var;
  iterator __end2_1;
  iterator __begin2_1;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *__range2_1;
  Var *iter;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *__range2;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *output_ordering;
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *output_values;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  string state_name;
  shared_ptr<kratos::EnumConst> state_enum;
  FSMState *state;
  iterator __end1;
  iterator __begin1;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__range1;
  undefined1 local_110 [8];
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  enable_shared_from_this<kratos::Var> local_e8;
  undefined1 local_d8 [8];
  shared_ptr<kratos::SwitchStmt> output_case_comb;
  shared_ptr<kratos::CombinationalStmtBlock> output_comb;
  unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *state_name_mapping_local;
  EnumVar *current_state_local;
  Enum *enum_def_local;
  FSM *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  undefined1 local_78 [40];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  undefined8 local_48;
  char *local_40 [2];
  Generator *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  Generator *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  Generator *local_10;
  
  Generator::combinational
            ((Generator *)
             &output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_e8);
  std::make_shared<kratos::SwitchStmt,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::Var> *)local_d8);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_e8);
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_110,this,false
            );
  num = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
        ::size(&enum_def->values);
  bVar1 = is_2_power(num);
  if (!bVar1) {
    __range1 = (vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)0x0;
    std::vector<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
    emplace_back<decltype(nullptr)>
              ((vector<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)local_110,&__range1);
  }
  __end1 = std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::begin
                     ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_110);
  state = (FSMState *)
          std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::end
                    ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_110);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
                                *)&state);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
              ::operator*(&__end1);
    state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppFVar2;
    std::shared_ptr<kratos::EnumConst>::shared_ptr
              ((shared_ptr<kratos::EnumConst> *)((long)&state_name.field_2 + 8));
    std::__cxx11::string::string((string *)local_168);
    if (state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__cxx11::string::operator=((string *)local_168,"default");
      std::shared_ptr<kratos::EnumConst>::shared_ptr
                ((shared_ptr<kratos::EnumConst> *)
                 &stmts.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
      std::shared_ptr<kratos::EnumConst>::operator=
                ((shared_ptr<kratos::EnumConst> *)((long)&state_name.field_2 + 8),
                 (shared_ptr<kratos::EnumConst> *)
                 &stmts.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<kratos::EnumConst>::~shared_ptr
                ((shared_ptr<kratos::EnumConst> *)
                 &stmts.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::__shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->start_state_).
                         super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      pmVar3 = std::
               unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(state_name_mapping,
                    (key_type *)
                    &state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      std::__cxx11::string::operator=((string *)local_168,(string *)pmVar3);
      Enum::get_enum((Enum *)local_178,(string *)enum_def);
      std::shared_ptr<kratos::EnumConst>::operator=
                ((shared_ptr<kratos::EnumConst> *)((long)&state_name.field_2 + 8),
                 (shared_ptr<kratos::EnumConst> *)local_178);
      std::shared_ptr<kratos::EnumConst>::~shared_ptr((shared_ptr<kratos::EnumConst> *)local_178);
    }
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *
           )&output_values);
    this_02 = FSMState::output_values
                        ((FSMState *)
                         state_enum.
                         super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)FSMState::output_ordering
                            ((FSMState *)
                             state_enum.
                             super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    sVar4 = std::
            map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
            ::size(this_02);
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    reserve((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)&output_values,sVar4);
    std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::vector
              ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&__range2);
    sVar4 = std::
            map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
            ::size(this_02);
    std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::reserve
              ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&__range2,sVar4);
    this_01 = vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin
                       ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)
                        vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    iter = (Var *)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end
                            ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                                  *)&iter);
      if (!bVar1) break;
      ppVVar5 = __gnu_cxx::
                __normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                ::operator*(&__end2);
      __range2_1 = (vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)*ppVVar5;
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&__range2,(Var **)&__range2_1)
      ;
      __gnu_cxx::
      __normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin
                         ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&__range2);
    output_var = (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end
                                   ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)
                                    &__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                          *)&output_var);
      if (!bVar1) break;
      __k = __gnu_cxx::
            __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
            ::operator*(&__end2_1);
      ppVVar6 = std::
                map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                ::at(this_02,__k);
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppVVar6;
      if (((Var *)stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (Var *)0x0) &&
         ((Var *)stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi != *__k)) {
        var = *__k;
        std::enable_shared_from_this<kratos::Var>::shared_from_this
                  ((enable_shared_from_this<kratos::Var> *)&debug_info._M_h._M_single_bucket);
        Var::assign((Var *)local_220,(shared_ptr<kratos::Var> *)var);
        std::shared_ptr<kratos::Var>::~shared_ptr
                  ((shared_ptr<kratos::Var> *)&debug_info._M_h._M_single_bucket);
        if ((this->generator_->debug & 1U) != 0) {
          puVar7 = FSMState::output_fn_ln_abi_cxx11_
                             ((FSMState *)
                              state_enum.
                              super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
          std::
          unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          ::unordered_map((unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                           *)local_268,puVar7);
          local_270._M_cur =
               (__node_type *)
               std::
               unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
               ::find((unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                       *)local_268,__k);
          case_stmt = (ScopedStmtBlock *)
                      std::
                      unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      ::end((unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                             *)local_268);
          bVar1 = std::__detail::operator!=
                            (&local_270,
                             (_Node_iterator_base<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>
                              *)&case_stmt);
          if (bVar1) {
            peVar8 = std::
                     __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_220);
            __args = std::
                     unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                     ::at((unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                           *)local_268,__k);
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)&(peVar8->super_Stmt).super_IRNode.fn_name_ln,__args);
          }
          std::
          unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          ::~unordered_map((unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                            *)local_268);
        }
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::AssignStmt>&>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)&output_values,(shared_ptr<kratos::AssignStmt> *)local_220);
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_220);
      }
      __gnu_cxx::
      __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
      ::operator++(&__end2_1);
    }
    bVar1 = std::
            vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
            empty((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   *)&output_values);
    if (!bVar1) {
      this_03 = std::
                __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_d8);
      std::shared_ptr<kratos::Const>::shared_ptr<kratos::EnumConst,void>
                ((shared_ptr<kratos::Const> *)(local_2b0 + 0x20),
                 (shared_ptr<kratos::EnumConst> *)((long)&state_name.field_2 + 8));
      pSVar9 = SwitchStmt::add_switch_case
                         (this_03,(shared_ptr<kratos::Const> *)(local_2b0 + 0x20),
                          (vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                           *)&output_values);
      std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)(local_2b0 + 0x20));
      this_00 = this->generator_;
      local_40[1] = local_2b0;
      local_40[0] = "{0}_{1}_Output";
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_168;
      local_280 = pSVar9;
      local_48 = this;
      fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string&,char[15],char>
                ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78,(v7 *)"{0}_{1}_Output",(char (*) [15])this,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,
                 (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R8.values_);
      local_78._32_8_ = local_78;
      bVar10 = fmt::v7::to_string_view<char,_0>(local_40[0]);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_30 = (Generator *)local_78._32_8_;
      local_20 = (Generator *)local_78._32_8_;
      local_10 = (Generator *)local_78._32_8_;
      local_18 = local_28;
      local_88 = bVar10;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_78._32_8_);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_90.values_;
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_88.size_;
      in_R8 = local_90;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_2b0,(detail *)local_88.data_,format_str,args);
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_2d0);
      std::shared_ptr<kratos::StmtBlock>::shared_ptr<kratos::ScopedStmtBlock,void>
                ((shared_ptr<kratos::StmtBlock> *)(local_2d0 + 0x10),
                 (shared_ptr<kratos::ScopedStmtBlock> *)local_2d0);
      Generator::add_named_block
                (this_00,(string *)local_2b0,(shared_ptr<kratos::StmtBlock> *)(local_2d0 + 0x10));
      std::shared_ptr<kratos::StmtBlock>::~shared_ptr
                ((shared_ptr<kratos::StmtBlock> *)(local_2d0 + 0x10));
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)local_2d0);
      std::__cxx11::string::~string((string *)local_2b0);
    }
    std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~vector
              ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&__range2);
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)&output_values);
    std::__cxx11::string::~string((string *)local_168);
    std::shared_ptr<kratos::EnumConst>::~shared_ptr
              ((shared_ptr<kratos::EnumConst> *)((long)&state_name.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<kratos::FSMState_**,_std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
    ::operator++(&__end1);
  }
  this_04 = &std::
             __shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&output_case_comb.
                              super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount)->super_StmtBlock;
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::SwitchStmt,void>
            (&local_2e0,(shared_ptr<kratos::SwitchStmt> *)local_d8);
  StmtBlock::add_stmt(this_04,&local_2e0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_2e0);
  std::vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~vector
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_110);
  std::shared_ptr<kratos::SwitchStmt>::~shared_ptr((shared_ptr<kratos::SwitchStmt> *)local_d8);
  std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::CombinationalStmtBlock> *)
             &output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void FSM::generate_output(Enum& enum_def, EnumVar& current_state,
                          const std::unordered_map<FSMState*, std::string>& state_name_mapping) {
    auto output_comb = generator_->combinational();
    auto output_case_comb = std::make_shared<SwitchStmt>(current_state.shared_from_this());
    auto states = get_all_child_states(false);

    // need to deal with fully specified case where default is the same as start state
    // also default case
    if (!is_2_power(enum_def.values.size())) {
        states.emplace_back(nullptr);
    }

    for (auto* state : states) {
        std::shared_ptr<EnumConst> state_enum;
        std::string state_name;
        if (state) {
            state_name = state_name_mapping.at(state);
            state_enum = enum_def.get_enum(state_name);
        } else {
            state_name = "default";
            state_enum = nullptr;
            // use default state outputs
            state = start_state_.get();
        }

        std::vector<std::shared_ptr<Stmt>> stmts;
        auto const& output_values = state->output_values();
        auto const& output_ordering = state->output_ordering();
        stmts.reserve(output_values.size());
        // sort the names
        std::vector<Var*> vars;
        vars.reserve(output_values.size());
        for (auto* iter : output_ordering) vars.emplace_back(iter);
        for (auto const& output_var : vars) {
            auto* value = output_values.at(output_var);
            if (value && value != output_var) {
                // value can be a nullptr
                // users may use the same variable to indicate not changed
                auto stmt = output_var->assign(value->shared_from_this());
                if (generator_->debug) {
                    auto debug_info = state->output_fn_ln();
                    if (debug_info.find(output_var) != debug_info.end())
                        stmt->fn_name_ln.emplace_back(debug_info.at(output_var));
                }
                stmts.emplace_back(stmt);
            }
        }
        // add it to the case
        if (!stmts.empty()) {
            auto& case_stmt = output_case_comb->add_switch_case(state_enum, stmts);
            generator_->add_named_block(::format("{0}_{1}_Output", fsm_name_, state_name),
                                        case_stmt.as<ScopedStmtBlock>());
        }
    }

    // add it to the output_comb
    output_comb->add_stmt(output_case_comb);
}